

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::identifier_expression::identifier_expression
          (identifier_expression *this,source_extend *extend,wstring *id)

{
  wstring *id_local;
  source_extend *extend_local;
  identifier_expression *this_local;
  
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__identifier_expression_0028e340;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  return;
}

Assistant:

explicit identifier_expression(const source_extend& extend, const std::wstring& id) : expression(extend), id_(id) {}